

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypePath.h
# Opt level: O2

int __thiscall Js::TypePath::Data::Add<true>(Data *this,PropertyRecord *propId,Type *assignments)

{
  byte value;
  code *pcVar1;
  bool bVar2;
  byte bVar3;
  undefined4 *puVar4;
  Type *local_40;
  Type *assignments_local;
  PropertyIndex temp;
  
  value = this->pathLength;
  bVar3 = this->pathSize;
  local_40 = assignments;
  if (bVar3 <= value) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Types/TypePath.h"
                                ,0x9b,"(currentPathLength < this->pathSize)",
                                "currentPathLength < this->pathSize");
    if (!bVar2) goto LAB_00aeb3ef;
    *puVar4 = 0;
    bVar3 = this->pathSize;
  }
  if (bVar3 <= value) {
    Throw::InternalError();
  }
  bVar2 = TinyDictionary::TryGetValue<Memory::WriteBarrierPtr<Js::PropertyRecord_const>*>
                    (&this->map,propId->pid,(PropertyIndex *)((long)&assignments_local + 6),
                     &local_40);
  if (bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Types/TypePath.h"
                                ,0xa7,"(false)","Adding a duplicate to the type path");
    if (!bVar2) {
LAB_00aeb3ef:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  TinyDictionary::Add(&this->map,propId->pid,value);
  Memory::WriteBarrierPtr<const_Js::PropertyRecord>::WriteBarrierSet
            ((WriteBarrierPtr<const_Js::PropertyRecord> *)
             ((long)&local_40->ptr + (ulong)((uint)value * 8)),propId);
  this->pathLength = this->pathLength + '\x01';
  return (uint)value;
}

Assistant:

int Add(const PropertyRecord* propId, Field(const PropertyRecord *)* assignments)
            {
                uint currentPathLength = this->pathLength;
                Assert(currentPathLength < this->pathSize);
                if (currentPathLength >= this->pathSize)
                {
                    Throw::InternalError();
                }

                if (addNewId)
                {
#if DBG
                    PropertyIndex temp;
                    if (this->map.TryGetValue(propId->GetPropertyId(), &temp, assignments))
                    {
                        AssertMsg(false, "Adding a duplicate to the type path");
                    }
#endif
                    this->map.Add((unsigned int)propId->GetPropertyId(), (byte)currentPathLength);
                }
                assignments[currentPathLength] = propId;
                this->pathLength++;
                return currentPathLength;
            }